

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integercompressor.cpp
# Opt level: O3

I32 __thiscall IntegerCompressor::readCorrector(IntegerCompressor *this,ArithmeticModel *mBits)

{
  byte bVar1;
  U32 UVar2;
  U32 UVar3;
  int k1;
  U32 bits;
  I32 IVar4;
  
  UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,mBits);
  this->k = UVar2;
  if (UVar2 != 0) {
    if (UVar2 < 0x20) {
      bits = UVar2 - this->bits_high;
      if (UVar2 < this->bits_high || bits == 0) {
        UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->mCorrector[UVar2]);
      }
      else {
        UVar3 = ArithmeticDecoder::decodeSymbol(this->dec,this->mCorrector[UVar2]);
        UVar2 = ArithmeticDecoder::readBits(this->dec,bits);
        UVar2 = UVar3 << ((byte)bits & 0x1f) | UVar2;
      }
      bVar1 = (byte)this->k;
      if ((int)UVar2 < 1 << (bVar1 - 1 & 0x1f)) {
        IVar4 = UVar2 + (-1 << (bVar1 & 0x1f)) + 1;
      }
      else {
        IVar4 = UVar2 + 1;
      }
    }
    else {
      IVar4 = this->corr_min;
    }
    return IVar4;
  }
  UVar2 = ArithmeticDecoder::decodeBit(this->dec,(ArithmeticBitModel *)*this->mCorrector);
  return UVar2;
}

Assistant:

I32 IntegerCompressor::readCorrector(ArithmeticModel* mBits)
{
  I32 c;

  // decode within which interval the corrector is falling

  k = dec->decodeSymbol(mBits);

  // decode the exact location of the corrector within the interval

#ifdef COMPRESS_ONLY_K
  if (k) // then c is either smaller than 0 or bigger than 1
  {
    if (k < 32)
    {
      c = dec->readBits(k);

      if (c >= (1<<(k-1))) // if c is in the interval [ 2^(k-1)  ...  + 2^k - 1 ]
      {
        // so we translate c back into the interval [ 2^(k-1) + 1  ...  2^k ] by adding 1 
        c += 1;
      }
      else // otherwise c is in the interval [ 0 ...  + 2^(k-1) - 1 ]
      {
        // so we translate c back into the interval [ - (2^k - 1)  ...  - (2^(k-1)) ] by subtracting (2^k - 1)
        c -= ((1<<k) - 1);
      }
    }
    else
    {
      c = corr_min;
    }
  }
  else // then c is either 0 or 1
  {
    c = dec->readBit();
  }
#else // COMPRESS_ONLY_K
  if (k) // then c is either smaller than 0 or bigger than 1
  {
    if (k < 32)
    {
      if (k <= bits_high) // for small k we can do this in one step
      {
        // decompress c with the range coder
        c = dec->decodeSymbol(mCorrector[k]);
      }
      else
      {
        // for larger k we need to do this in two steps
        int k1 = k-bits_high;
        // decompress higher bits with table
        c = dec->decodeSymbol(mCorrector[k]);
        // read lower bits raw
        int c1 = dec->readBits(k1);
        // put the corrector back together
        c = (c << k1) | c1;
      }
      // translate c back into its correct interval
      if (c >= (1<<(k-1))) // if c is in the interval [ 2^(k-1)  ...  + 2^k - 1 ]
      {
        // so we translate c back into the interval [ 2^(k-1) + 1  ...  2^k ] by adding 1 
        c += 1;
      }
      else // otherwise c is in the interval [ 0 ...  + 2^(k-1) - 1 ]
      {
        // so we translate c back into the interval [ - (2^k - 1)  ...  - (2^(k-1)) ] by subtracting (2^k - 1)
        c -= ((1<<k) - 1);
      }
    }
    else
    {
      c = corr_min;
    }
  }
  else // then c is either 0 or 1
  {
    c = dec->decodeBit((ArithmeticBitModel*)mCorrector[0]);
  }
#endif // COMPRESS_ONLY_K

  return c;
}